

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O3

void __thiscall
draco::SequentialAttributeDecodersController::SequentialAttributeDecodersController
          (SequentialAttributeDecodersController *this,
          unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
          *sequencer)

{
  AttributesDecoder::AttributesDecoder(&this->super_AttributesDecoder);
  (this->super_AttributesDecoder).super_AttributesDecoderInterface._vptr_AttributesDecoderInterface
       = (_func_int **)&PTR__SequentialAttributeDecodersController_001dc6c0;
  (this->sequential_decoders_).
  super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sequential_decoders_).
  super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sequential_decoders_).
  super__Vector_base<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->point_ids_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->point_ids_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->point_ids_).
  super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sequencer_)._M_t.
  super___uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>._M_t.
  super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>.
  super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
       (sequencer->_M_t).
       super___uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>.
       _M_t.
       super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
       .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl;
  (sequencer->_M_t).
  super___uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>._M_t.
  super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>.
  super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl = (PointsSequencer *)0x0;
  return;
}

Assistant:

SequentialAttributeDecodersController::SequentialAttributeDecodersController(
    std::unique_ptr<PointsSequencer> sequencer)
    : sequencer_(std::move(sequencer)) {}